

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

UdpOutputPortDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpOutputPortDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::EqualsValueClauseSyntax*>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,EqualsValueClauseSyntax **args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  EqualsValueClauseSyntax *pEVar3;
  size_t sVar4;
  pointer ppAVar5;
  Info *pIVar6;
  SyntaxNode *pSVar7;
  undefined4 uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  UdpOutputPortDeclSyntax *pUVar21;
  long lVar22;
  
  pUVar21 = (UdpOutputPortDeclSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UdpOutputPortDeclSyntax *)this->endPtr < pUVar21 + 1) {
    pUVar21 = (UdpOutputPortDeclSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pUVar21 + 1);
  }
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar13 = args_2->kind;
  uVar14 = args_2->field_0x2;
  NVar15.raw = (args_2->numFlags).raw;
  uVar16 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar17 = args_3->kind;
  uVar18 = args_3->field_0x2;
  NVar19.raw = (args_3->numFlags).raw;
  uVar20 = args_3->rawLen;
  pIVar6 = args_3->info;
  pEVar3 = *args_4;
  (pUVar21->super_UdpPortDeclSyntax).super_SyntaxNode.kind = UdpOutputPortDecl;
  (pUVar21->super_UdpPortDeclSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pUVar21->super_UdpPortDeclSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pUVar21->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar8 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar7 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pUVar21->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pUVar21->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar8;
  (pUVar21->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       pSVar7;
  (pUVar21->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00698df0;
  (pUVar21->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar4 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pUVar21->super_UdpPortDeclSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pUVar21->super_UdpPortDeclSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar4;
  (pUVar21->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00698d40;
  (pUVar21->super_UdpPortDeclSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pUVar21;
  sVar4 = (pUVar21->super_UdpPortDeclSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar4 != 0) {
    ppAVar5 = (pUVar21->super_UdpPortDeclSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar22 = 0;
    do {
      *(UdpOutputPortDeclSyntax **)(*(long *)((long)ppAVar5 + lVar22) + 8) = pUVar21;
      lVar22 = lVar22 + 8;
    } while (sVar4 << 3 != lVar22);
  }
  (pUVar21->keyword).kind = TVar9;
  (pUVar21->keyword).field_0x2 = uVar10;
  (pUVar21->keyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pUVar21->keyword).rawLen = uVar12;
  (pUVar21->keyword).info = pIVar1;
  (pUVar21->reg).kind = TVar13;
  (pUVar21->reg).field_0x2 = uVar14;
  (pUVar21->reg).numFlags = (NumericTokenFlags)NVar15.raw;
  (pUVar21->reg).rawLen = uVar16;
  (pUVar21->reg).info = pIVar2;
  (pUVar21->name).kind = TVar17;
  (pUVar21->name).field_0x2 = uVar18;
  (pUVar21->name).numFlags = (NumericTokenFlags)NVar19.raw;
  (pUVar21->name).rawLen = uVar20;
  (pUVar21->name).info = pIVar6;
  pUVar21->initializer = pEVar3;
  if (pEVar3 != (EqualsValueClauseSyntax *)0x0) {
    (pEVar3->super_SyntaxNode).parent = (SyntaxNode *)pUVar21;
  }
  return pUVar21;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }